

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O2

shared_ptr<LNode> __thiscall LParser::reduce_29(LParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  shared_ptr<LNode> sVar1;
  __shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> local_50;
  shared_ptr<LNode> local_40;
  shared_ptr<LNode> fcall;
  
  get_node((LParser *)&fcall,in_ESI);
  get_node(this,in_ESI);
  std::__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,(__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> *)this);
  std::static_pointer_cast<LNodeData<LNodeChildren>,LNode>(&local_40);
  std::vector<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_>::push_back
            ((vector<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_> *)
             (local_40.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1),
             (value_type *)&fcall);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fcall.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::reduce_29() {
    // FCalls : FCall FCalls
    auto fcall = this->get_node(2);
    auto fcalls = this->get_node(1);
    lnode_get<LNodeChildren>(fcalls)->value.push_front(fcall);
    return fcalls;
}